

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O0

void __thiscall client::mini_xml_printer::operator()(mini_xml_printer *this,mini_xml *xml)

{
  bool bVar1;
  ostream *poVar2;
  byte local_69;
  mini_xml_node_printer local_5c;
  type local_58;
  mini_xml_node *node;
  __normal_iterator<const_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Stack_48;
  bool _foreach_continue117;
  auto_any_base *local_40;
  auto_any_t _foreach_end117;
  auto_any_base *local_30;
  auto_any_t _foreach_cur117;
  auto_any_t local_20;
  auto_any_t _foreach_col117;
  mini_xml *xml_local;
  mini_xml_printer *this_local;
  
  _foreach_col117 = (auto_any_t)xml;
  xml_local = (mini_xml *)this;
  tab(this->indent);
  poVar2 = std::operator<<((ostream *)&std::cout,"tag: ");
  poVar2 = std::operator<<(poVar2,(string *)_foreach_col117);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tab(this->indent);
  poVar2 = std::operator<<((ostream *)&std::cout,'{');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _foreach_cur117 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>,std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>>>const>
                 ((vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(_foreach_col117 + 0x20),(false_ *)0x0);
  local_20 = (auto_any_t)&_foreach_cur117;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_20);
  if (!bVar1) {
    _foreach_end117 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>,std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>>>,mpl_::bool_<true>>
                   (local_20,(type2type<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<true>_>
                              *)0x0,(false_ *)0x0);
    local_30 = (auto_any_base *)&_foreach_end117;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_30);
    if (!bVar1) {
      _Stack_48._M_current =
           (variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)boost::foreach_detail_::
              end<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>,std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>>>,mpl_::bool_<true>>
                        (local_20,(type2type<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<true>_>
                                   *)0x0,(false_ *)0x0);
      local_40 = (auto_any_base *)&stack0xffffffffffffffb8;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_40);
      if (!bVar1) {
        node._7_1_ = 1;
        while( true ) {
          local_69 = 0;
          if ((node._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>,std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>>>,mpl_::bool_<true>>
                              (local_30,local_40,
                               (type2type<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<true>_>
                                *)0x0);
            local_69 = bVar1 ^ 0xff;
          }
          if ((local_69 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&node + 7));
          if (!bVar1) {
            local_58 = boost::foreach_detail_::
                       deref<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>,std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>>>,mpl_::bool_<true>>
                                 (local_30,(type2type<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<true>_>
                                            *)0x0);
            while (((node._7_1_ ^ 0xff) & 1) != 0) {
              mini_xml_node_printer::mini_xml_node_printer(&local_5c,this->indent);
              boost::
              apply_visitor<client::mini_xml_node_printer,boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>const&>
                        (&local_5c,local_58);
              node._7_1_ = 1;
            }
          }
          if ((node._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>,std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>>>,mpl_::bool_<true>>
                      (local_30,(type2type<std::vector<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<true>_>
                                 *)0x0);
          }
        }
      }
    }
  }
  tab(this->indent);
  poVar2 = std::operator<<((ostream *)&std::cout,'}');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void mini_xml_printer::operator()(mini_xml const& xml) const
    {
        tab(indent);
        std::cout << "tag: " << xml.name << std::endl;
        tab(indent);
        std::cout << '{' << std::endl;

        BOOST_FOREACH(mini_xml_node const& node, xml.children)
        {
            boost::apply_visitor(mini_xml_node_printer(indent), node);
        }

        tab(indent);
        std::cout << '}' << std::endl;
    }